

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int uv_read_start(uv_stream_t *stream,uv_alloc_cb alloc_cb,uv_read_cb read_cb)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  
  if ((UV_TTY < stream->type) || ((0x5080U >> (stream->type & (UV_SIGNAL|UV_UDP)) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x60b,"int uv_read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
  }
  iVar3 = -0x16;
  if ((stream->flags & 1) == 0) {
    stream->flags = stream->flags | 4;
    if ((stream->io_watcher).fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x619,"int uv_read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
    }
    if (alloc_cb == (uv_alloc_cb)0x0) {
      __assert_fail("alloc_cb",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x61a,"int uv_read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
    }
    stream->read_cb = read_cb;
    stream->alloc_cb = alloc_cb;
    uv__io_start(stream->loop,&stream->io_watcher,1);
    uVar2 = stream->flags;
    iVar3 = 0;
    if (((uVar2 >> 0xe & 1) == 0) &&
       (stream->flags = uVar2 | 0x4000, iVar3 = 0, (uVar2 >> 0xd & 1) != 0)) {
      puVar1 = &stream->loop->active_handles;
      *puVar1 = *puVar1 + 1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int uv_read_start(uv_stream_t* stream,
                  uv_alloc_cb alloc_cb,
                  uv_read_cb read_cb) {
  assert(stream->type == UV_TCP || stream->type == UV_NAMED_PIPE ||
      stream->type == UV_TTY);

  if (stream->flags & UV_CLOSING)
    return -EINVAL;

  /* The UV_STREAM_READING flag is irrelevant of the state of the tcp - it just
   * expresses the desired state of the user.
   */
  stream->flags |= UV_STREAM_READING;

  /* TODO: try to do the read inline? */
  /* TODO: keep track of tcp state. If we've gotten a EOF then we should
   * not start the IO watcher.
   */
  assert(uv__stream_fd(stream) >= 0);
  assert(alloc_cb);

  stream->read_cb = read_cb;
  stream->alloc_cb = alloc_cb;

  uv__io_start(stream->loop, &stream->io_watcher, POLLIN);
  uv__handle_start(stream);
  uv__stream_osx_interrupt_select(stream);

  return 0;
}